

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

int Gia_ManCountDepth(Gia_ManEra_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Gia_ObjEra_t *local_30;
  int local_1c;
  Gia_ObjEra_t *pGStack_18;
  int Counter;
  Gia_ObjEra_t *pState;
  Gia_ManEra_t *p_local;
  
  local_1c = 0;
  pGStack_18 = (Gia_ObjEra_t *)Vec_PtrEntryLast(p->vStates);
  if ((pGStack_18->iPrev == 0) && (iVar1 = Vec_PtrSize(p->vStates), 3 < iVar1)) {
    p_00 = p->vStates;
    iVar1 = Vec_PtrSize(p->vStates);
    pGStack_18 = (Gia_ObjEra_t *)Vec_PtrEntry(p_00,iVar1 + -2);
  }
  while (pGStack_18 != (Gia_ObjEra_t *)0x0) {
    local_1c = local_1c + 1;
    if (pGStack_18->iPrev == 0) {
      local_30 = (Gia_ObjEra_t *)0x0;
    }
    else {
      local_30 = Gia_ManEraState(p,pGStack_18->iPrev);
    }
    pGStack_18 = local_30;
  }
  return local_1c;
}

Assistant:

int Gia_ManCountDepth( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pState;
    int Counter = 0;
    pState = (Gia_ObjEra_t *)Vec_PtrEntryLast( p->vStates );
    if ( pState->iPrev == 0 && Vec_PtrSize(p->vStates) > 3 )
        pState = (Gia_ObjEra_t *)Vec_PtrEntry( p->vStates, Vec_PtrSize(p->vStates) - 2 );
    for ( ; pState; pState = pState->iPrev ? Gia_ManEraState(p, pState->iPrev) : NULL )
        Counter++;
    return Counter;
}